

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void DestroyVocab(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  lVar2 = 0;
  while( true ) {
    if (vocab_size <= lVar2) break;
    free(*(void **)((long)&vocab->word + lVar1));
    free(*(void **)((long)&vocab->code + lVar1));
    free(*(void **)((long)&vocab->point + lVar1));
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0x28;
  }
  free(vocab[vocab_size].word);
  free(vocab);
  return;
}

Assistant:

void DestroyVocab() {
  int a;

  for (a = 0; a < vocab_size; a++) {
    if (vocab[a].word != NULL) {
      free(vocab[a].word);
    }
    if (vocab[a].code != NULL) {
      free(vocab[a].code);
    }
    if (vocab[a].point != NULL) {
      free(vocab[a].point);
    }
  }
  free(vocab[vocab_size].word);
  free(vocab);
}